

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::MILSpec::Dimension::ByteSizeLong(Dimension *this)

{
  uint uVar1;
  size_t sVar2;
  
  if (this->_oneof_case_[0] == 2) {
    uVar1 = (uint)((this->dimension_).unknown_)->variadic_ * 2;
    ((this->dimension_).unknown_)->_cached_size_ = uVar1;
    sVar2 = (ulong)uVar1 + 2;
  }
  else if (this->_oneof_case_[0] == 1) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                      ((this->dimension_).constant_);
    sVar2 = sVar2 + 1;
  }
  else {
    sVar2 = 0;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t Dimension::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Dimension)
  size_t total_size = 0;

  switch (dimension_case()) {
    // .CoreML.Specification.MILSpec.Dimension.ConstantDimension constant = 1;
    case kConstant: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *dimension_.constant_);
      break;
    }
    // .CoreML.Specification.MILSpec.Dimension.UnknownDimension unknown = 2;
    case kUnknown: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *dimension_.unknown_);
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}